

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::EnumValueDescriptorProto::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar3;
  int line;
  Arena *arena;
  Arena *arena_00;
  EnumValueDescriptorProto *_this;
  EnumValueDescriptorProto *local_30;
  MessageLite *local_28 [2];
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  local_30 = (EnumValueDescriptorProto *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::EnumValueDescriptorProto_const*,google::protobuf::EnumValueDescriptorProto*>
                          ((EnumValueDescriptorProto **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x1bed;
LAB_00178846:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      uVar2 = from_msg[1]._internal_metadata_.ptr_;
      (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      arena = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_30->field_0)._impl_.name_,(string *)(uVar2 & 0xfffffffffffffffc),arena);
    }
    if ((uVar1 & 2) != 0) {
      from_msg_00 = (MessageLite *)from_msg[2]._vptr_MessageLite;
      if (from_msg_00 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.options_ != nullptr";
        line = 0x1bf7;
        goto LAB_00178846;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0x10);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar3 = Arena::CopyConstruct<google::protobuf::EnumValueOptions>(arena_00,from_msg_00);
        *(void **)((long)&local_30->field_0 + 0x10) = pvVar3;
      }
      else {
        EnumValueOptions::MergeImpl(to_msg_00,from_msg_00);
      }
    }
    if ((uVar1 & 4) != 0) {
      *(int *)((long)&local_30->field_0 + 0x18) = (int)from_msg[2]._internal_metadata_.ptr_;
    }
  }
  (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void EnumValueDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<EnumValueDescriptorProto*>(&to_msg);
  auto& from = static_cast<const EnumValueDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumValueDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.number_ = from._impl_.number_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}